

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O0

void __thiscall
ApprovalTests::Windows::WindowsDiffReporter::WindowsDiffReporter(WindowsDiffReporter *this)

{
  initializer_list<ApprovalTests::Reporter_*> __l;
  void *pvVar1;
  WinMergeReporter *this_00;
  FirstWorkingReporter *this_01;
  Reporter *pRVar2;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *this_02;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *this_03;
  undefined8 *in_RDI;
  allocator_type *__a;
  iterator ppRVar3;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *theReporters;
  BeyondCompareReporter *in_stack_ffffffffffffff40;
  void *local_78;
  void *local_70;
  void *local_68;
  WinMergeReporter *local_60;
  undefined1 local_58 [24];
  void *local_40;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *local_38;
  void **local_30;
  undefined8 local_28;
  
  pvVar1 = operator_new(0x20);
  TortoiseDiffReporter::TortoiseDiffReporter((TortoiseDiffReporter *)in_stack_ffffffffffffff40);
  local_78 = pvVar1;
  pvVar1 = operator_new(0x20);
  TortoiseGitDiffReporter::TortoiseGitDiffReporter
            ((TortoiseGitDiffReporter *)in_stack_ffffffffffffff40);
  local_70 = pvVar1;
  pvVar1 = operator_new(0x20);
  BeyondCompareReporter::BeyondCompareReporter(in_stack_ffffffffffffff40);
  local_68 = pvVar1;
  this_00 = (WinMergeReporter *)operator_new(0x70);
  WinMergeReporter::WinMergeReporter(this_00);
  theReporters = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
                 local_58;
  local_60 = this_00;
  this_01 = (FirstWorkingReporter *)operator_new(0x70);
  AraxisMergeReporter::AraxisMergeReporter((AraxisMergeReporter *)this_00);
  (theReporters->
  super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)this_01;
  ppRVar3 = (iterator)(local_58 + 8);
  pRVar2 = (Reporter *)operator_new(0x70);
  CodeCompareReporter::CodeCompareReporter((CodeCompareReporter *)this_00);
  *ppRVar3 = pRVar2;
  __a = (allocator_type *)(local_58 + 0x10);
  this_02 = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
            operator_new(0x70);
  SublimeMergeReporter::SublimeMergeReporter((SublimeMergeReporter *)this_00);
  *(vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> **)__a = this_02;
  pvVar1 = operator_new(0x70);
  KDiff3Reporter::KDiff3Reporter((KDiff3Reporter *)this_00);
  local_40 = pvVar1;
  this_03 = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
            operator_new(0x70);
  VisualStudioCodeReporter::VisualStudioCodeReporter((VisualStudioCodeReporter *)this_00);
  local_30 = &local_78;
  local_28 = 9;
  local_38 = this_03;
  ::std::allocator<ApprovalTests::Reporter_*>::allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x138748);
  __l._M_len = (size_type)pRVar2;
  __l._M_array = ppRVar3;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (this_02,__l,__a);
  FirstWorkingReporter::FirstWorkingReporter(this_01,theReporters);
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::~vector
            (this_03);
  ::std::allocator<ApprovalTests::Reporter_*>::~allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x13879d);
  *in_RDI = &PTR__WindowsDiffReporter_002989f8;
  return;
}

Assistant:

WindowsDiffReporter::WindowsDiffReporter()
            : FirstWorkingReporter({
                  // begin-snippet: windows_diff_reporters
                  new TortoiseDiffReporter(), // Note that this uses Tortoise SVN Diff
                  new TortoiseGitDiffReporter(),
                  new BeyondCompareReporter(),
                  new WinMergeReporter(),
                  new AraxisMergeReporter(),
                  new CodeCompareReporter(),
                  new SublimeMergeReporter(),
                  new KDiff3Reporter(),
                  new VisualStudioCodeReporter(),
                  // end-snippet
              })
        {
        }